

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O1

Node * __thiscall
icu_63::StringTrieBuilder::makeBranchSubNode
          (StringTrieBuilder *this,int32_t start,int32_t limit,int32_t unitIndex,int32_t length,
          UErrorCode *errorCode)

{
  ushort uVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  int unitIndex_00;
  int iVar5;
  int iVar6;
  Node *pNVar7;
  Node *pNVar8;
  long lVar9;
  int32_t iVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  undefined4 in_register_00000034;
  ulong size;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  UChar middleUnits [14];
  Node *lessThan [14];
  ushort auStack_c8 [8];
  long alStack_b8 [17];
  
  size = CONCAT44(in_register_00000034,start);
  uVar15 = 0;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar16 = (ulong)(uint)length;
    uVar14 = (ulong)(uint)unitIndex;
    uVar13 = (ulong)(uint)start;
    iVar3 = (*(this->super_UObject)._vptr_UObject[0xb])();
    if (iVar3 < length) {
      uVar15 = 0;
      uVar12 = uVar13;
      do {
        uVar11 = (int)(uVar16 >> 0x1f) + (int)uVar16 >> 1;
        uVar4 = (*(this->super_UObject)._vptr_UObject[8])(this,uVar12,uVar14,(ulong)uVar11);
        uVar13 = (ulong)uVar4;
        iVar3 = (*(this->super_UObject)._vptr_UObject[4])(this,(ulong)uVar4,uVar14);
        auStack_c8[uVar15] = (ushort)iVar3;
        pNVar7 = makeBranchSubNode(this,(int32_t)uVar12,uVar4,unitIndex,uVar11,errorCode);
        alStack_b8[uVar15 + 2] = (long)pNVar7;
        uVar15 = uVar15 + 1;
        length = (int)uVar16 - uVar11;
        uVar16 = (ulong)(uint)length;
        size = uVar12;
        iVar3 = (*(this->super_UObject)._vptr_UObject[0xb])(this);
        uVar12 = uVar13;
      } while (iVar3 < length);
    }
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      pNVar7 = (Node *)UMemory::operator_new((UMemory *)0x68,size);
      if (pNVar7 == (Node *)0x0) {
        pNVar7 = (Node *)0x0;
      }
      else {
        pNVar7->hash = 0x444444;
        pNVar7->offset = 0;
        (pNVar7->super_UObject)._vptr_UObject = (_func_int **)&PTR__UObject_003ec198;
        *(undefined4 *)&pNVar7[4].super_UObject._vptr_UObject = 0;
      }
      if (pNVar7 != (Node *)0x0) {
        unitIndex_00 = unitIndex + 1;
        iVar3 = 1;
        if (1 < (int)(length - 1U)) {
          iVar3 = length - 1U;
        }
        do {
          iVar6 = (int)uVar13;
          uVar4 = (*(this->super_UObject)._vptr_UObject[4])(this,uVar13,uVar14);
          uVar11 = (*(this->super_UObject)._vptr_UObject[9])(this,(ulong)(iVar6 + 1),uVar14);
          if ((iVar6 == uVar11 - 1) &&
             (iVar5 = (*(this->super_UObject)._vptr_UObject[3])(this,uVar13), unitIndex_00 == iVar5)
             ) {
            iVar6 = (*(this->super_UObject)._vptr_UObject[5])(this,uVar13);
            lVar9 = (long)*(int *)&pNVar7[4].super_UObject._vptr_UObject;
            *(short *)((long)&pNVar7[5].hash + lVar9 * 2) = (short)uVar4;
            *(undefined8 *)(&pNVar7[1].hash + lVar9 * 2) = 0;
            *(int *)((long)&pNVar7[4].super_UObject._vptr_UObject + lVar9 * 4 + 4) = iVar6;
            *(int *)&pNVar7[4].super_UObject._vptr_UObject =
                 *(int *)&pNVar7[4].super_UObject._vptr_UObject + 1;
          }
          else {
            pNVar8 = makeNode(this,iVar6,uVar11,unitIndex_00,errorCode);
            lVar9 = (long)*(int *)&pNVar7[4].super_UObject._vptr_UObject;
            *(short *)((long)&pNVar7[5].hash + lVar9 * 2) = (short)uVar4;
            *(Node **)(&pNVar7[1].hash + lVar9 * 2) = pNVar8;
            *(undefined4 *)((long)&pNVar7[4].super_UObject._vptr_UObject + lVar9 * 4 + 4) = 0;
            *(int *)&pNVar7[4].super_UObject._vptr_UObject =
                 *(int *)&pNVar7[4].super_UObject._vptr_UObject + 1;
            if (pNVar8 == (Node *)0x0) {
              iVar6 = 0;
            }
            else {
              iVar6 = pNVar8->hash;
            }
          }
          pNVar7->hash = (pNVar7->hash * 0x25 + (uVar4 & 0xffff)) * 0x25 + iVar6;
          uVar13 = (ulong)uVar11;
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
        uVar4 = (*(this->super_UObject)._vptr_UObject[4])(this,(ulong)uVar11,uVar14);
        if ((uVar11 == limit - 1U) &&
           (iVar3 = (*(this->super_UObject)._vptr_UObject[3])(this,(ulong)uVar11),
           unitIndex_00 == iVar3)) {
          iVar3 = (*(this->super_UObject)._vptr_UObject[5])(this,(ulong)uVar11);
          lVar9 = (long)*(int *)&pNVar7[4].super_UObject._vptr_UObject;
          *(short *)((long)&pNVar7[5].hash + lVar9 * 2) = (short)uVar4;
          *(undefined8 *)(&pNVar7[1].hash + lVar9 * 2) = 0;
          *(int *)((long)&pNVar7[4].super_UObject._vptr_UObject + lVar9 * 4 + 4) = iVar3;
          *(int *)&pNVar7[4].super_UObject._vptr_UObject =
               *(int *)&pNVar7[4].super_UObject._vptr_UObject + 1;
          pNVar7->hash = (pNVar7->hash * 0x25 + (uVar4 & 0xffff)) * 0x25 + iVar3;
        }
        else {
          pNVar8 = makeNode(this,uVar11,limit,unitIndex_00,errorCode);
          lVar9 = (long)*(int *)&pNVar7[4].super_UObject._vptr_UObject;
          *(short *)((long)&pNVar7[5].hash + lVar9 * 2) = (short)uVar4;
          *(Node **)(&pNVar7[1].hash + lVar9 * 2) = pNVar8;
          *(undefined4 *)((long)&pNVar7[4].super_UObject._vptr_UObject + lVar9 * 4 + 4) = 0;
          *(int *)&pNVar7[4].super_UObject._vptr_UObject =
               *(int *)&pNVar7[4].super_UObject._vptr_UObject + 1;
          if (pNVar8 == (Node *)0x0) {
            iVar3 = 0;
          }
          else {
            iVar3 = pNVar8->hash;
          }
          pNVar7->hash = (pNVar7->hash * 0x25 + (uVar4 & 0xffff)) * 0x25 + iVar3;
        }
        pNVar8 = registerNode(this,pNVar7,errorCode);
        if ((int)uVar15 < 1) {
          return pNVar8;
        }
        lVar9 = (uVar15 & 0xffffffff) + 1;
        do {
          pNVar7 = (Node *)UMemory::operator_new((UMemory *)0x28,(size_t)pNVar7);
          if (pNVar7 == (Node *)0x0) {
            pNVar7 = (Node *)0x0;
          }
          else {
            lVar2 = alStack_b8[lVar9];
            iVar10 = 0;
            iVar3 = 0;
            if (lVar2 != 0) {
              iVar3 = *(int *)(lVar2 + 8);
            }
            if (pNVar8 != (Node *)0x0) {
              iVar10 = pNVar8->hash;
            }
            uVar1 = auStack_c8[lVar9 + -2];
            pNVar7->hash = iVar10 + ((uint)uVar1 * 0x25 + iVar3) * 0x25 + -0xbaaec9f;
            pNVar7->offset = 0;
            (pNVar7->super_UObject)._vptr_UObject = (_func_int **)&PTR__UObject_003ec1f0;
            *(ushort *)((long)&pNVar7[1].super_UObject._vptr_UObject + 4) = uVar1;
            pNVar7[1].hash = (int)lVar2;
            pNVar7[1].offset = (int)((ulong)lVar2 >> 0x20);
            pNVar7[2].super_UObject._vptr_UObject = (_func_int **)pNVar8;
          }
          pNVar8 = registerNode(this,pNVar7,errorCode);
          lVar9 = lVar9 + -1;
        } while (1 < lVar9);
        return pNVar8;
      }
      *errorCode = U_MEMORY_ALLOCATION_ERROR;
    }
  }
  return (Node *)0x0;
}

Assistant:

StringTrieBuilder::Node *
StringTrieBuilder::makeBranchSubNode(int32_t start, int32_t limit, int32_t unitIndex,
                                   int32_t length, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return NULL;
    }
    UChar middleUnits[kMaxSplitBranchLevels];
    Node *lessThan[kMaxSplitBranchLevels];
    int32_t ltLength=0;
    while(length>getMaxBranchLinearSubNodeLength()) {
        // Branch on the middle unit.
        // First, find the middle unit.
        int32_t i=skipElementsBySomeUnits(start, unitIndex, length/2);
        // Create the less-than branch.
        middleUnits[ltLength]=getElementUnit(i, unitIndex);  // middle unit
        lessThan[ltLength]=makeBranchSubNode(start, i, unitIndex, length/2, errorCode);
        ++ltLength;
        // Continue for the greater-or-equal branch.
        start=i;
        length=length-length/2;
    }
    if(U_FAILURE(errorCode)) {
        return NULL;
    }
    ListBranchNode *listNode=new ListBranchNode();
    if(listNode==NULL) {
        errorCode=U_MEMORY_ALLOCATION_ERROR;
        return NULL;
    }
    // For each unit, find its elements array start and whether it has a final value.
    int32_t unitNumber=0;
    do {
        int32_t i=start;
        UChar unit=getElementUnit(i++, unitIndex);
        i=indexOfElementWithNextUnit(i, unitIndex, unit);
        if(start==i-1 && unitIndex+1==getElementStringLength(start)) {
            listNode->add(unit, getElementValue(start));
        } else {
            listNode->add(unit, makeNode(start, i, unitIndex+1, errorCode));
        }
        start=i;
    } while(++unitNumber<length-1);
    // unitNumber==length-1, and the maxUnit elements range is [start..limit[
    UChar unit=getElementUnit(start, unitIndex);
    if(start==limit-1 && unitIndex+1==getElementStringLength(start)) {
        listNode->add(unit, getElementValue(start));
    } else {
        listNode->add(unit, makeNode(start, limit, unitIndex+1, errorCode));
    }
    Node *node=registerNode(listNode, errorCode);
    // Create the split-branch nodes.
    while(ltLength>0) {
        --ltLength;
        node=registerNode(
            new SplitBranchNode(middleUnits[ltLength], lessThan[ltLength], node), errorCode);
    }
    return node;
}